

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# built_in_functions.cpp
# Opt level: O1

void __thiscall
duckdb::BuiltinFunctions::AddCollation
          (BuiltinFunctions *this,string *name,ScalarFunction *function,bool combinable,
          bool not_required_for_equality)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  scalar_function_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Manager_type p_Var4;
  long lVar5;
  bind_scalar_function_t *pp_Var6;
  bind_scalar_function_t *pp_Var7;
  byte bVar8;
  CreateCollationInfo info;
  string local_3f8;
  LogicalType *local_3d8;
  ScalarFunction local_3d0;
  CreateCollationInfo local_2a8;
  
  bVar8 = 0;
  local_3f8._M_dataplus._M_p = (pointer)&local_3f8.field_2;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(name->_M_dataplus)._M_p;
  paVar1 = &name->field_2;
  if (paVar3 == paVar1) {
    local_3f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_3f8.field_2._8_8_ = *(undefined8 *)((long)&name->field_2 + 8);
  }
  else {
    local_3f8.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_3f8._M_dataplus._M_p = (pointer)paVar3;
  }
  local_3f8._M_string_length = name->_M_string_length;
  (name->_M_dataplus)._M_p = (pointer)paVar1;
  name->_M_string_length = 0;
  (name->field_2)._M_local_buf[0] = '\0';
  SimpleFunction::SimpleFunction((SimpleFunction *)&local_3d0,(SimpleFunction *)function);
  local_3d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  local_3d8 = &local_3d0.super_BaseScalarFunction.return_type;
  LogicalType::LogicalType(local_3d8,&(function->super_BaseScalarFunction).return_type);
  local_3d0.super_BaseScalarFunction.stability = (function->super_BaseScalarFunction).stability;
  local_3d0.super_BaseScalarFunction.null_handling =
       (function->super_BaseScalarFunction).null_handling;
  local_3d0.super_BaseScalarFunction.errors = (function->super_BaseScalarFunction).errors;
  local_3d0.super_BaseScalarFunction.collation_handling =
       (function->super_BaseScalarFunction).collation_handling;
  local_3d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  local_3d0.function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_3d0.function.super__Function_base._M_functor._8_8_ = 0;
  local_3d0.function.super__Function_base._M_manager = (_Manager_type)0x0;
  local_3d0.function._M_invoker = (function->function)._M_invoker;
  p_Var4 = (function->function).super__Function_base._M_manager;
  if (p_Var4 != (_Manager_type)0x0) {
    local_3d0.function.super__Function_base._M_functor._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(function->function).super__Function_base._M_functor;
    local_3d0.function.super__Function_base._M_functor._8_8_ =
         *(undefined8 *)((long)&(function->function).super__Function_base._M_functor + 8);
    (function->function).super__Function_base._M_manager = (_Manager_type)0x0;
    (function->function)._M_invoker = (_Invoker_type)0x0;
    local_3d0.function.super__Function_base._M_manager = p_Var4;
  }
  pp_Var6 = &function->bind;
  pp_Var7 = &local_3d0.bind;
  for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
    *pp_Var7 = *pp_Var6;
    pp_Var6 = pp_Var6 + (ulong)bVar8 * -2 + 1;
    pp_Var7 = pp_Var7 + (ulong)bVar8 * -2 + 1;
  }
  local_3d0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (function->function_info).internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_3d0.function_info.internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (function->function_info).internal.
       super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (function->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (function->function_info).internal.
  super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  CreateCollationInfo::CreateCollationInfo
            (&local_2a8,&local_3f8,&local_3d0,combinable,not_required_for_equality);
  local_3d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_3d0.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3d0.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_3d0.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_3d0.function.super__Function_base._M_manager)
              ((_Any_data *)&local_3d0.function,(_Any_data *)&local_3d0.function,__destroy_functor);
  }
  local_3d0.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::~LogicalType(local_3d8);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_3d0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p);
  }
  local_2a8.super_CreateInfo.internal = true;
  Catalog::CreateCollation(this->catalog,this->transaction,&local_2a8);
  local_2a8.super_CreateInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)&PTR__CreateCollationInfo_02492310;
  local_2a8.function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__ScalarFunction_024743d0;
  if (local_2a8.function.function_info.internal.
      super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2a8.function.function_info.internal.
               super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_2a8.function.function.super__Function_base._M_manager != (_Manager_type)0x0) {
    psVar2 = &local_2a8.function.function;
    (*local_2a8.function.function.super__Function_base._M_manager)
              ((_Any_data *)psVar2,(_Any_data *)psVar2,__destroy_functor);
  }
  local_2a8.function.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
       (_func_int **)&PTR__BaseScalarFunction_02474b40;
  LogicalType::~LogicalType(&local_2a8.function.super_BaseScalarFunction.return_type);
  SimpleFunction::~SimpleFunction((SimpleFunction *)&local_2a8.function);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8.name._M_dataplus._M_p != &local_2a8.name.field_2) {
    operator_delete(local_2a8.name._M_dataplus._M_p);
  }
  CreateInfo::~CreateInfo(&local_2a8.super_CreateInfo);
  return;
}

Assistant:

void BuiltinFunctions::AddCollation(string name, ScalarFunction function, bool combinable,
                                    bool not_required_for_equality) {
	CreateCollationInfo info(std::move(name), std::move(function), combinable, not_required_for_equality);
	info.internal = true;
	catalog.CreateCollation(transaction, info);
}